

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  lu_byte *plVar1;
  byte bVar2;
  int iVar3;
  FuncState *pFVar4;
  lua_State *L;
  Proto *pPVar5;
  bool bVar6;
  int iVar7;
  Proto **ppPVar8;
  TString *pTVar9;
  long lVar10;
  BlockCnt bl;
  FuncState new_fs;
  BlockCnt local_98;
  FuncState local_80;
  
  pFVar4 = ls->fs;
  L = ls->L;
  pPVar5 = pFVar4->f;
  iVar7 = pPVar5->sizep;
  lVar10 = (long)iVar7;
  if (iVar7 <= pFVar4->np) {
    ppPVar8 = (Proto **)luaM_growaux_(L,pPVar5->p,pFVar4->np,&pPVar5->sizep,8,0x1ffff,"functions");
    pPVar5->p = ppPVar8;
    iVar3 = pPVar5->sizep;
    if (iVar7 < iVar3) {
      do {
        pPVar5->p[lVar10] = (Proto *)0x0;
        lVar10 = lVar10 + 1;
      } while (iVar3 != lVar10);
    }
  }
  local_80.f = luaF_newproto(L);
  ppPVar8 = pPVar5->p;
  iVar7 = pFVar4->np;
  pFVar4->np = iVar7 + 1;
  ppPVar8[iVar7] = local_80.f;
  if (((pPVar5->marked & 0x20) != 0) && (((local_80.f)->marked & 0x18) != 0)) {
    luaC_barrier_(L,(GCObject *)pPVar5,(GCObject *)local_80.f);
  }
  (local_80.f)->linedefined = line;
  open_func(ls,&local_80,&local_98);
  checknext(ls,0x28);
  if (ismethod != 0) {
    pTVar9 = luaX_newstring(ls,"self",4);
    new_localvarkind(ls,pTVar9,'\0');
    adjustlocalvars(ls,1);
  }
  pFVar4 = ls->fs;
  pPVar5 = pFVar4->f;
  if ((ls->t).token == 0x29) {
    bVar6 = true;
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    while( true ) {
      iVar3 = (ls->t).token;
      if (iVar3 == 0x118) {
        luaX_next(ls);
        bVar6 = false;
      }
      else {
        if (iVar3 != 0x123) {
          luaX_syntaxerror(ls,"<name> or \'...\' expected");
        }
        pTVar9 = str_checkname(ls);
        new_localvarkind(ls,pTVar9,'\0');
        iVar7 = iVar7 + 1;
        bVar6 = true;
      }
      if ((!bVar6) || ((ls->t).token != 0x2c)) break;
      luaX_next(ls);
    }
  }
  adjustlocalvars(ls,iVar7);
  bVar2 = pFVar4->nactvar;
  pPVar5->numparams = bVar2;
  if (!bVar6) {
    plVar1 = &pFVar4->f->flag;
    *plVar1 = *plVar1 | 1;
    luaK_codeABCk(pFVar4,OP_VARARGPREP,(uint)bVar2,0,0,0);
  }
  luaK_reserveregs(pFVar4,(uint)pFVar4->nactvar);
  checknext(ls,0x29);
  statlist(ls);
  (local_80.f)->lastlinedefined = ls->linenumber;
  check_match(ls,0x105,0x108,line);
  pFVar4 = ls->fs->prev;
  iVar7 = luaK_codeABx(pFVar4,OP_CLOSURE,0,pFVar4->np + -1);
  e->t = -1;
  e->f = -1;
  e->k = VRELOC;
  (e->u).info = iVar7;
  luaK_exp2nextreg(pFVar4,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  '(' parlist ')' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}